

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vdpu382_com.c
# Opt level: O1

void vdpu382_afbc_align_calc(MppBufSlots slots,MppFrame frame,RK_U32 expand)

{
  RK_U32 RVar1;
  RK_U32 RVar2;
  
  RVar1 = mpp_frame_get_height(frame);
  RVar2 = mpp_frame_get_width(frame);
  if (*compat_ext_fbc_hdr_256_odd == 0) {
    RVar2 = RVar2 + 0x3f & 0xffffffc0;
  }
  else {
    RVar2 = RVar2 + 0xff & 0xfffffe00 | 0x100;
  }
  mpp_slots_set_prop(slots,SLOTS_HOR_ALIGN,mpp_align_64);
  mpp_slots_set_prop(slots,SLOTS_VER_ALIGN,mpp_align_16);
  mpp_frame_set_fbc_hdr_stride(frame,RVar2);
  RVar1 = mpp_align_16(RVar1);
  if (*compat_ext_fbc_buf_size == 0) {
    expand = 0;
  }
  mpp_frame_set_ver_stride(frame,expand + RVar1);
  return;
}

Assistant:

void vdpu382_afbc_align_calc(MppBufSlots slots, MppFrame frame, RK_U32 expand)
{
    RK_U32 ver_stride = 0;
    RK_U32 img_height = mpp_frame_get_height(frame);
    RK_U32 img_width = mpp_frame_get_width(frame);
    RK_U32 hdr_stride = (*compat_ext_fbc_hdr_256_odd) ?
                        (MPP_ALIGN(img_width, 256) | 256) :
                        (MPP_ALIGN(img_width, 64));

    mpp_slots_set_prop(slots, SLOTS_HOR_ALIGN, mpp_align_64);
    mpp_slots_set_prop(slots, SLOTS_VER_ALIGN, mpp_align_16);

    mpp_frame_set_fbc_hdr_stride(frame, hdr_stride);

    ver_stride = mpp_align_16(img_height);
    if (*compat_ext_fbc_buf_size) {
        ver_stride += expand;
    }
    mpp_frame_set_ver_stride(frame, ver_stride);
}